

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

TextureFormat vk::getDepthCopyFormat(VkFormat combinedFormat)

{
  TextureFormat TStack_10;
  VkFormat combinedFormat_local;
  
  switch(combinedFormat) {
  case VK_FORMAT_D16_UNORM:
  case VK_FORMAT_X8_D24_UNORM_PACK32:
  case VK_FORMAT_D32_SFLOAT:
    TStack_10 = mapVkFormat(combinedFormat);
    break;
  case VK_FORMAT_S8_UINT:
  default:
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0);
    break;
  case VK_FORMAT_D16_UNORM_S8_UINT:
    TStack_10 = mapVkFormat(VK_FORMAT_D16_UNORM);
    break;
  case VK_FORMAT_D24_UNORM_S8_UINT:
    TStack_10 = mapVkFormat(VK_FORMAT_X8_D24_UNORM_PACK32);
    break;
  case VK_FORMAT_D32_SFLOAT_S8_UINT:
    TStack_10 = mapVkFormat(VK_FORMAT_D32_SFLOAT);
  }
  return TStack_10;
}

Assistant:

tcu::TextureFormat getDepthCopyFormat (VkFormat combinedFormat)
{
	switch (combinedFormat)
	{
		case VK_FORMAT_D16_UNORM:
		case VK_FORMAT_X8_D24_UNORM_PACK32:
		case VK_FORMAT_D32_SFLOAT:
			return mapVkFormat(combinedFormat);

		case VK_FORMAT_D16_UNORM_S8_UINT:
			return mapVkFormat(VK_FORMAT_D16_UNORM);
		case VK_FORMAT_D24_UNORM_S8_UINT:
			return mapVkFormat(VK_FORMAT_X8_D24_UNORM_PACK32);
		case VK_FORMAT_D32_SFLOAT_S8_UINT:
			return mapVkFormat(VK_FORMAT_D32_SFLOAT);

		case VK_FORMAT_S8_UINT:
		default:
			DE_FATAL("Unexpected depth/stencil format");
			return tcu::TextureFormat();
	}
}